

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapstyle.cpp
# Opt level: O3

int __thiscall
QPixmapStyle::styleHint
          (QPixmapStyle *this,StyleHint hint,QStyleOption *option,QWidget *widget,
          QStyleHintReturn *returnData)

{
  int iVar1;
  
  if ((hint != SH_EtchDisabledText) && (hint != SH_ComboBox_Popup)) {
    iVar1 = QCommonStyle::styleHint(&this->super_QCommonStyle,hint,option,widget,returnData);
    return iVar1;
  }
  return 0;
}

Assistant:

int QPixmapStyle::styleHint(StyleHint hint, const QStyleOption *option,
                            const QWidget *widget, QStyleHintReturn *returnData) const
{
    switch (hint) {
    case SH_EtchDisabledText:
        return false;
    case SH_ComboBox_Popup:
        return false;
    default: ;
    }

    return QCommonStyle::styleHint(hint, option, widget, returnData);
}